

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::SetCVRow(ON_NurbsSurface *this,int row_index,ON_3dPoint *point)

{
  bool bVar1;
  int i;
  
  ON_Surface::DestroySurfaceTree(&this->super_ON_Surface);
  if ((row_index < 0) || (this->m_cv_count[1] < row_index)) {
    bVar1 = false;
  }
  else if (this->m_cv_count[0] < 1) {
    bVar1 = true;
  }
  else {
    i = 0;
    do {
      bVar1 = SetCV(this,i,row_index,point);
      if (!bVar1) {
        return bVar1;
      }
      i = i + 1;
    } while (i < this->m_cv_count[0]);
  }
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::SetCVRow(
       int row_index,
       const ON_3dPoint& point
       )
{
  DestroySurfaceTree();
  int i;

  if ( row_index < 0 || row_index > m_cv_count[1] )
    return false;

  for ( i = 0; i < m_cv_count[0]; i++ ) {
    if ( !SetCV( i, row_index, point ) )
      return false;
  }

  return true;
}